

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
          (Action<pstore::address_(unsigned_long,_unsigned_int)> *this,
          InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
          *fun)

{
  offset_in_mock_database_to_subr oVar1;
  undefined8 uVar2;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  _Any_data __tmp;
  
  (this->fun_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fun_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fun_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  __tmp._M_unused._M_object = operator_new(0x18);
  uVar2 = local_48._8_8_;
  *(undefined8 *)((long)__tmp._M_unused._0_8_ + 0x10) = *(undefined8 *)&fun->field_0x10;
  oVar1 = fun->method_ptr;
  *(mock_database **)__tmp._M_unused._0_8_ = fun->obj_ptr;
  *(offset_in_mock_database_to_subr *)((long)__tmp._M_unused._0_8_ + 8) = oVar1;
  __tmp._8_8_ = local_48._8_8_;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  *(undefined8 *)&(this->fun_).super__Function_base._M_functor = __tmp._M_unused._M_object;
  *(undefined8 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = uVar2;
  local_38 = 0;
  (this->fun_).super__Function_base._M_manager =
       std::
       _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
       ::_M_manager;
  uStack_30 = 0;
  (this->fun_)._M_invoker =
       std::
       _Function_handler<pstore::address_(unsigned_long,_unsigned_int),_testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>_>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

Action(G&& fun) {  // NOLINT
    Init(::std::forward<G>(fun), IsCompatibleFunctor<G>());
  }